

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O1

int pzshape::TPZShapeTetra::NConnectShapeF(int side,int order)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar8 [16];
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  
  iVar4 = 1;
  if (3 < side) {
    if (side < 10) {
      iVar4 = order + -1;
    }
    else {
      if (side < 0xe) {
        if (1 < order) {
          return order + (int)((ulong)(order - 3) * (ulong)(order - 2) >> 1) + -2;
        }
      }
      else if (side == 0xe) {
        if (3 < order) {
          uVar5 = order - 4;
          iVar15 = 1;
          iVar17 = 2;
          uVar19 = 3;
          iVar21 = 4;
          iVar4 = 4;
          uVar7 = 0;
          uVar10 = 0;
          uVar12 = 0;
          uVar14 = 0;
          do {
            uVar13 = uVar14;
            uVar11 = uVar12;
            uVar9 = uVar10;
            uVar6 = uVar7;
            auVar8._0_4_ = iVar15 + 1;
            auVar8._4_4_ = iVar17 + 1;
            auVar8._8_4_ = uVar19 + 1;
            auVar8._12_4_ = iVar21 + 1;
            uVar7 = ((uint)(auVar8._0_4_ * iVar15) >> 1) + uVar6;
            uVar10 = ((uint)(iVar17 * auVar8._4_4_) >> 1) + uVar9;
            uVar12 = ((uint)((auVar8._8_8_ & 0xffffffff) * (ulong)uVar19) >> 1) + uVar11;
            uVar14 = ((uint)(iVar21 * auVar8._12_4_) >> 1) + uVar13;
            iVar15 = iVar15 + 4;
            iVar17 = iVar17 + 4;
            uVar19 = uVar19 + 4;
            iVar21 = iVar21 + 4;
            iVar2 = iVar4 + -4;
            iVar3 = iVar4 + (order & 0x7ffffffcU);
            iVar4 = iVar2;
          } while (iVar3 != 8);
          uVar19 = -iVar2;
          uVar16 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)(uVar19 ^ 0x80000000));
          uVar18 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar19 | 1) ^ 0x80000000));
          uVar20 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar19 | 2) ^ 0x80000000));
          uVar5 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar19 | 3) ^ 0x80000000));
          return (~uVar5 & uVar14 | uVar13 & uVar5) + (~uVar18 & uVar10 | uVar9 & uVar18) +
                 (~uVar20 & uVar12 | uVar11 & uVar20) + (~uVar16 & uVar7 | uVar6 & uVar16);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"TPZCompElT3d::NConnectShapeF, bad parameter side ",0x31);
        plVar1 = (long *)std::ostream::operator<<(&std::cerr,side);
        std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
        std::ostream::put((char)plVar1);
        std::ostream::flush();
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int TPZShapeTetra::NConnectShapeF(int side, int order) {
		if(side<4) return 1;//0 a 3
		//   int s = side-4;
		if(side<10) return order-1;//4 a 9
		if(side<14) {//10 a 13
			int sum = 0;
			for(int i=0;i<order-1;i++) sum += i;
			return sum;
		}
		if(side==14) {
			int totsum = 0,sum;
			for(int i=1;i<order-2;i++) {
				sum = i*(i+1) / 2;
				totsum += sum;
			}
			return totsum;
		}
		PZError << "TPZCompElT3d::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}